

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_setup_conn(connectdata *conn)

{
  CURLcode CVar1;
  void *pvVar2;
  
  pvVar2 = (*Curl_ccalloc)(1,0x88);
  (conn->data->req).protop = pvVar2;
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (pvVar2 != (void *)0x0) {
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http_setup_conn(struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the SessionHandle, only to survive
     during this request */
  DEBUGASSERT(conn->data->req.protop == NULL);

  conn->data->req.protop = calloc(1, sizeof(struct HTTP));
  if(!conn->data->req.protop)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}